

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngset.c
# Opt level: O1

void png_set_hIST(png_const_structrp png_ptr,png_inforp info_ptr,png_const_uint_16p hist)

{
  png_uint_16p __dest;
  char *warning_message;
  
  if (info_ptr == (png_inforp)0x0 || png_ptr == (png_const_structrp)0x0) {
    return;
  }
  if ((*(int *)&info_ptr->num_palette - 0x101U & 0xffff) < 0xff00) {
    warning_message = "Invalid palette size, hIST allocation skipped";
  }
  else {
    png_free_data(png_ptr,info_ptr,8,0);
    __dest = (png_uint_16p)png_malloc_warn(png_ptr,0x200);
    info_ptr->hist = __dest;
    if (__dest != (png_uint_16p)0x0) {
      *(byte *)&info_ptr->free_me = (byte)info_ptr->free_me | 8;
      if (info_ptr->num_palette != 0) {
        memcpy(__dest,hist,(ulong)((uint)info_ptr->num_palette * 2));
      }
      *(byte *)&info_ptr->valid = (byte)info_ptr->valid | 0x40;
      return;
    }
    warning_message = "Insufficient memory for hIST chunk data";
  }
  png_warning(png_ptr,warning_message);
  return;
}

Assistant:

void PNGAPI
png_set_hIST(png_const_structrp png_ptr, png_inforp info_ptr,
    png_const_uint_16p hist)
{
   int i;

   png_debug1(1, "in %s storage function", "hIST");

   if (png_ptr == NULL || info_ptr == NULL)
      return;

   if (info_ptr->num_palette == 0 || info_ptr->num_palette
       > PNG_MAX_PALETTE_LENGTH)
   {
      png_warning(png_ptr,
          "Invalid palette size, hIST allocation skipped");

      return;
   }

   png_free_data(png_ptr, info_ptr, PNG_FREE_HIST, 0);

   /* Changed from info->num_palette to PNG_MAX_PALETTE_LENGTH in
    * version 1.2.1
    */
   info_ptr->hist = png_voidcast(png_uint_16p, png_malloc_warn(png_ptr,
       PNG_MAX_PALETTE_LENGTH * (sizeof (png_uint_16))));

   if (info_ptr->hist == NULL)
   {
      png_warning(png_ptr, "Insufficient memory for hIST chunk data");

      return;
   }

   info_ptr->free_me |= PNG_FREE_HIST;

   for (i = 0; i < info_ptr->num_palette; i++)
      info_ptr->hist[i] = hist[i];

   info_ptr->valid |= PNG_INFO_hIST;
}